

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

void __thiscall
ddd::DaTrie<false,_true,_false>::pop_block_
          (DaTrie<false,_true,_false> *this,uint32_t block_pos,
          vector<ddd::Block,_std::allocator<ddd::Block>_> *blocks)

{
  pointer pBVar1;
  Bc BVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar4 = block_pos * 0x100;
  if (uVar4 != 0xffffff00) {
    uVar3 = (ulong)uVar4;
    do {
      if (uVar3 == this->head_pos_) {
        this->head_pos_ =
             *(uint *)((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                       super__Vector_impl_data._M_start + this->head_pos_) & 0x7fffffff;
      }
      pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_start;
      BVar2 = pBVar1[uVar3];
      uVar6 = (ulong)BVar2 & 0x7fffffff;
      uVar5 = (ulong)BVar2 >> 0x20 & 0x7fffffff;
      *(int *)(pBVar1 + uVar5) = (int)uVar6;
      pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_start;
      pBVar1[uVar6] = (Bc)((ulong)pBVar1[uVar6] & 0x80000000ffffffff | uVar5 << 0x20);
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar4 + 0x100);
  }
  return;
}

Assistant:

void pop_block_(uint32_t block_pos, std::vector<Block>& blocks) {
    auto begin = block_pos * BLOCK_SIZE;
    auto end = begin + BLOCK_SIZE;

    for (auto pos = begin; pos < end; ++pos) {
      if (pos == head_pos_) {
        head_pos_ = next_(head_pos_);
      }
      auto next = next_(pos);
      auto prev = prev_(pos);
      set_next_(prev, next);
      set_prev_(next, prev);
    }
  }